

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

MemoryStreamReaderPtr __thiscall
Assimp::Ogre::OgreBinarySerializer::OpenReader
          (OgreBinarySerializer *this,IOSystem *pIOHandler,string *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  StreamReader<false,_false> *this_00;
  Logger *pLVar4;
  runtime_error *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  MemoryStreamReaderPtr MVar6;
  long *local_1c0;
  long local_1b0 [2];
  string local_1a0 [3];
  ios_base local_130 [264];
  
  paVar1 = &local_1a0[0].field_2;
  local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,".skeleton","");
  bVar2 = EndsWith(filename,local_1a0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    iVar3 = (*pIOHandler->_vptr_IOSystem[2])(pIOHandler,(filename->_M_dataplus)._M_p);
    if ((char)iVar3 != '\0') {
      local_1a0[0]._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"rb","");
      iVar3 = (*pIOHandler->_vptr_IOSystem[4])
                        (pIOHandler,(filename->_M_dataplus)._M_p,local_1a0[0]._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a0[0]._M_dataplus._M_p,local_1a0[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((IOStream *)CONCAT44(extraout_var,iVar3) == (IOStream *)0x0) {
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+(local_1a0,"Failed to open skeleton file ",filename);
        std::runtime_error::runtime_error(this_01,(string *)local_1a0);
        *(undefined ***)this_01 = &PTR__runtime_error_008bf448;
        __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
      this_00 = (StreamReader<false,_false> *)operator_new(0x38);
      StreamReader<false,_false>::StreamReader
                (this_00,(IOStream *)CONCAT44(extraout_var,iVar3),false);
      *(StreamReader<false,_false> **)this = this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Assimp::StreamReader<false,false>*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->m_reader,this_00);
      _Var5._M_pi = extraout_RDX;
      goto LAB_00468e79;
    }
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[31]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
               (char (*) [31])"Failed to find skeleton file \'");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"\' that is referenced by imported Mesh.",0x26);
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar4,(char *)local_1c0);
  }
  else {
    pLVar4 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[46]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0,
               (char (*) [46])"Imported Mesh is referencing to unsupported \'");
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"\' skeleton file.",0x10);
    std::__cxx11::stringbuf::str();
    Logger::error(pLVar4,(char *)local_1c0);
  }
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  *(undefined8 *)this = 0;
  this->m_reader = (MemoryStreamReader *)0x0;
  _Var5._M_pi = extraout_RDX_00;
LAB_00468e79:
  MVar6.super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var5._M_pi;
  MVar6.super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MemoryStreamReaderPtr)
         MVar6.super___shared_ptr<Assimp::StreamReader<false,_false>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MemoryStreamReaderPtr OgreBinarySerializer::OpenReader(Assimp::IOSystem *pIOHandler, const std::string &filename)
{
    if (!EndsWith(filename, ".skeleton", false))
    {
        ASSIMP_LOG_ERROR_F("Imported Mesh is referencing to unsupported '", filename, "' skeleton file.");
        return MemoryStreamReaderPtr();
    }

    if (!pIOHandler->Exists(filename))
    {
        ASSIMP_LOG_ERROR_F("Failed to find skeleton file '", filename, "' that is referenced by imported Mesh.");
        return MemoryStreamReaderPtr();
    }

    IOStream *f = pIOHandler->Open(filename, "rb");
    if (!f) {
        throw DeadlyImportError("Failed to open skeleton file " + filename);
    }

    return MemoryStreamReaderPtr(new MemoryStreamReader(f));
}